

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout-test.c++
# Opt level: O3

void __thiscall capnp::_::anon_unknown_0::TestCase327::run(TestCase327 *this)

{
  StructBuilder builder_00;
  StructBuilder builder_01;
  StructReader reader;
  StructReader reader_00;
  SegmentBuilder *segment;
  ArrayPtr<const_capnp::word> *pAVar1;
  AllocateResult AVar2;
  ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> AVar3;
  Fault f;
  StructBuilder builder;
  BuilderArena arena;
  MallocMessageBuilder message;
  size_t local_268;
  PointerReader local_260;
  uint local_23c;
  StructBuilder local_238;
  StructReader local_210 [2];
  undefined1 in_stack_fffffffffffffe60 [32];
  SegmentBuilder *in_stack_fffffffffffffe80;
  undefined1 in_stack_fffffffffffffe88 [32];
  size_t in_stack_fffffffffffffea8;
  MallocMessageBuilder local_110;
  
  MallocMessageBuilder::MallocMessageBuilder(&local_110,0,FIXED_SIZE);
  BuilderArena::BuilderArena
            ((BuilderArena *)&stack0xfffffffffffffe50,&local_110.super_MessageBuilder);
  AVar2 = BuilderArena::allocate((BuilderArena *)&stack0xfffffffffffffe50,1);
  local_260.pointer = (WirePointer *)AVar2.words;
  segment = AVar2.segment;
  local_260.capTable = (CapTableReader *)0x0;
  local_260.segment = &segment->super_SegmentReader;
  PointerBuilder::initStruct(&local_238,(PointerBuilder *)&local_260,(StructSize)0x40002);
  builder_00._32_8_ = in_stack_fffffffffffffe80;
  builder_00.segment = (SegmentBuilder *)in_stack_fffffffffffffe60._0_8_;
  builder_00.capTable = (CapTableBuilder *)in_stack_fffffffffffffe60._8_8_;
  builder_00.data = (void *)in_stack_fffffffffffffe60._16_8_;
  builder_00.pointers = (WirePointer *)in_stack_fffffffffffffe60._24_8_;
  setupStruct(builder_00);
  AVar3 = BuilderArena::getSegmentsForOutput((BuilderArena *)&stack0xfffffffffffffe50);
  pAVar1 = AVar3.ptr;
  if (AVar3.size_ == 0xf) {
    if (kj::_::Debug::minSeverity < 3 && (SegmentBuilder *)pAVar1->size_ != (SegmentBuilder *)0x1) {
      local_268 = CONCAT44(local_268._4_4_,1);
      local_260.segment = (SegmentReader *)pAVar1->size_;
      kj::_::Debug::log<char_const(&)[47],unsigned_int,unsigned_long>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
                 ,0x158,ERROR,
                 "\"failed: expected \" \"(1u) == (segments[ 0].size())\", 1u, segments[ 0].size()",
                 (char (*) [47])"failed: expected (1u) == (segments[ 0].size())",(uint *)&local_268,
                 (unsigned_long *)&local_260);
    }
    if (kj::_::Debug::minSeverity < 3 && (SegmentBuilder *)pAVar1[1].size_ != (SegmentBuilder *)0x7)
    {
      local_268 = CONCAT44(local_268._4_4_,7);
      local_260.segment = (SegmentReader *)pAVar1[1].size_;
      kj::_::Debug::log<char_const(&)[47],unsigned_int,unsigned_long>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
                 ,0x159,ERROR,
                 "\"failed: expected \" \"(7u) == (segments[ 1].size())\", 7u, segments[ 1].size()",
                 (char (*) [47])"failed: expected (7u) == (segments[ 1].size())",(uint *)&local_268,
                 (unsigned_long *)&local_260);
    }
    if (kj::_::Debug::minSeverity < 3 && (SegmentBuilder *)pAVar1[2].size_ != (SegmentBuilder *)0x2)
    {
      local_268 = CONCAT44(local_268._4_4_,2);
      local_260.segment = (SegmentReader *)pAVar1[2].size_;
      kj::_::Debug::log<char_const(&)[47],unsigned_int,unsigned_long>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
                 ,0x15a,ERROR,
                 "\"failed: expected \" \"(2u) == (segments[ 2].size())\", 2u, segments[ 2].size()",
                 (char (*) [47])"failed: expected (2u) == (segments[ 2].size())",(uint *)&local_268,
                 (unsigned_long *)&local_260);
    }
    if (((SegmentBuilder *)pAVar1[3].size_ != (SegmentBuilder *)0x3) &&
       (kj::_::Debug::minSeverity < 3)) {
      local_268 = CONCAT44(local_268._4_4_,3);
      local_260.segment = (SegmentReader *)pAVar1[3].size_;
      kj::_::Debug::log<char_const(&)[47],unsigned_int,unsigned_long>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
                 ,0x15b,ERROR,
                 "\"failed: expected \" \"(3u) == (segments[ 3].size())\", 3u, segments[ 3].size()",
                 (char (*) [47])"failed: expected (3u) == (segments[ 3].size())",(uint *)&local_268,
                 (unsigned_long *)&local_260);
    }
    if (((SegmentBuilder *)pAVar1[4].size_ != (SegmentBuilder *)0xa) &&
       (kj::_::Debug::minSeverity < 3)) {
      local_268 = CONCAT44(local_268._4_4_,10);
      local_260.segment = (SegmentReader *)pAVar1[4].size_;
      kj::_::Debug::log<char_const(&)[48],unsigned_int,unsigned_long>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
                 ,0x15c,ERROR,
                 "\"failed: expected \" \"(10u) == (segments[ 4].size())\", 10u, segments[ 4].size()"
                 ,(char (*) [48])"failed: expected (10u) == (segments[ 4].size())",
                 (uint *)&local_268,(unsigned_long *)&local_260);
    }
    if (((SegmentBuilder *)pAVar1[5].size_ != (SegmentBuilder *)0x2) &&
       (kj::_::Debug::minSeverity < 3)) {
      local_268 = CONCAT44(local_268._4_4_,2);
      local_260.segment = (SegmentReader *)pAVar1[5].size_;
      kj::_::Debug::log<char_const(&)[47],unsigned_int,unsigned_long>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
                 ,0x15d,ERROR,
                 "\"failed: expected \" \"(2u) == (segments[ 5].size())\", 2u, segments[ 5].size()",
                 (char (*) [47])"failed: expected (2u) == (segments[ 5].size())",(uint *)&local_268,
                 (unsigned_long *)&local_260);
    }
    if (((SegmentBuilder *)pAVar1[6].size_ != (SegmentBuilder *)0x2) &&
       (kj::_::Debug::minSeverity < 3)) {
      local_268 = CONCAT44(local_268._4_4_,2);
      local_260.segment = (SegmentReader *)pAVar1[6].size_;
      kj::_::Debug::log<char_const(&)[47],unsigned_int,unsigned_long>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
                 ,0x15e,ERROR,
                 "\"failed: expected \" \"(2u) == (segments[ 6].size())\", 2u, segments[ 6].size()",
                 (char (*) [47])"failed: expected (2u) == (segments[ 6].size())",(uint *)&local_268,
                 (unsigned_long *)&local_260);
    }
    if (((SegmentBuilder *)pAVar1[7].size_ != (SegmentBuilder *)0x2) &&
       (kj::_::Debug::minSeverity < 3)) {
      local_268 = CONCAT44(local_268._4_4_,2);
      local_260.segment = (SegmentReader *)pAVar1[7].size_;
      kj::_::Debug::log<char_const(&)[47],unsigned_int,unsigned_long>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
                 ,0x15f,ERROR,
                 "\"failed: expected \" \"(2u) == (segments[ 7].size())\", 2u, segments[ 7].size()",
                 (char (*) [47])"failed: expected (2u) == (segments[ 7].size())",(uint *)&local_268,
                 (unsigned_long *)&local_260);
    }
    if (((SegmentBuilder *)pAVar1[8].size_ != (SegmentBuilder *)0x2) &&
       (kj::_::Debug::minSeverity < 3)) {
      local_268 = CONCAT44(local_268._4_4_,2);
      local_260.segment = (SegmentReader *)pAVar1[8].size_;
      kj::_::Debug::log<char_const(&)[47],unsigned_int,unsigned_long>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
                 ,0x160,ERROR,
                 "\"failed: expected \" \"(2u) == (segments[ 8].size())\", 2u, segments[ 8].size()",
                 (char (*) [47])"failed: expected (2u) == (segments[ 8].size())",(uint *)&local_268,
                 (unsigned_long *)&local_260);
    }
    if (((SegmentBuilder *)pAVar1[9].size_ != (SegmentBuilder *)0x6) &&
       (kj::_::Debug::minSeverity < 3)) {
      local_268 = CONCAT44(local_268._4_4_,6);
      local_260.segment = (SegmentReader *)pAVar1[9].size_;
      kj::_::Debug::log<char_const(&)[47],unsigned_int,unsigned_long>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
                 ,0x161,ERROR,
                 "\"failed: expected \" \"(6u) == (segments[ 9].size())\", 6u, segments[ 9].size()",
                 (char (*) [47])"failed: expected (6u) == (segments[ 9].size())",(uint *)&local_268,
                 (unsigned_long *)&local_260);
    }
    if (((SegmentBuilder *)pAVar1[10].size_ != (SegmentBuilder *)0x2) &&
       (kj::_::Debug::minSeverity < 3)) {
      local_268 = CONCAT44(local_268._4_4_,2);
      local_260.segment = (SegmentReader *)pAVar1[10].size_;
      kj::_::Debug::log<char_const(&)[47],unsigned_int,unsigned_long>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
                 ,0x162,ERROR,
                 "\"failed: expected \" \"(2u) == (segments[10].size())\", 2u, segments[10].size()",
                 (char (*) [47])"failed: expected (2u) == (segments[10].size())",(uint *)&local_268,
                 (unsigned_long *)&local_260);
    }
    if (((SegmentBuilder *)pAVar1[0xb].size_ != (SegmentBuilder *)0x2) &&
       (kj::_::Debug::minSeverity < 3)) {
      local_268 = CONCAT44(local_268._4_4_,2);
      local_260.segment = (SegmentReader *)pAVar1[0xb].size_;
      kj::_::Debug::log<char_const(&)[47],unsigned_int,unsigned_long>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
                 ,0x163,ERROR,
                 "\"failed: expected \" \"(2u) == (segments[11].size())\", 2u, segments[11].size()",
                 (char (*) [47])"failed: expected (2u) == (segments[11].size())",(uint *)&local_268,
                 (unsigned_long *)&local_260);
    }
    if (((SegmentBuilder *)pAVar1[0xc].size_ != (SegmentBuilder *)0x2) &&
       (kj::_::Debug::minSeverity < 3)) {
      local_268 = CONCAT44(local_268._4_4_,2);
      local_260.segment = (SegmentReader *)pAVar1[0xc].size_;
      kj::_::Debug::log<char_const(&)[47],unsigned_int,unsigned_long>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
                 ,0x164,ERROR,
                 "\"failed: expected \" \"(2u) == (segments[12].size())\", 2u, segments[12].size()",
                 (char (*) [47])"failed: expected (2u) == (segments[12].size())",(uint *)&local_268,
                 (unsigned_long *)&local_260);
    }
    if (((SegmentBuilder *)pAVar1[0xd].size_ != (SegmentBuilder *)0x2) &&
       (kj::_::Debug::minSeverity < 3)) {
      local_268 = CONCAT44(local_268._4_4_,2);
      local_260.segment = (SegmentReader *)pAVar1[0xd].size_;
      kj::_::Debug::log<char_const(&)[47],unsigned_int,unsigned_long>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
                 ,0x165,ERROR,
                 "\"failed: expected \" \"(2u) == (segments[13].size())\", 2u, segments[13].size()",
                 (char (*) [47])"failed: expected (2u) == (segments[13].size())",(uint *)&local_268,
                 (unsigned_long *)&local_260);
    }
    if (((SegmentBuilder *)pAVar1[0xe].size_ != (SegmentBuilder *)0x3) &&
       (kj::_::Debug::minSeverity < 3)) {
      local_268 = CONCAT44(local_268._4_4_,3);
      local_260.segment = (SegmentReader *)pAVar1[0xe].size_;
      kj::_::Debug::log<char_const(&)[47],unsigned_int,unsigned_long>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
                 ,0x166,ERROR,
                 "\"failed: expected \" \"(3u) == (segments[14].size())\", 3u, segments[14].size()",
                 (char (*) [47])"failed: expected (3u) == (segments[14].size())",(uint *)&local_268,
                 (unsigned_long *)&local_260);
    }
    builder_01.capTable = (CapTableBuilder *)in_stack_fffffffffffffe88._0_8_;
    builder_01.data = (void *)in_stack_fffffffffffffe88._8_8_;
    builder_01.pointers = (WirePointer *)in_stack_fffffffffffffe88._16_8_;
    builder_01.dataSize = in_stack_fffffffffffffe88._24_4_;
    builder_01.pointerCount = in_stack_fffffffffffffe88._28_2_;
    builder_01._38_2_ = in_stack_fffffffffffffe88._30_2_;
    builder_01.segment = in_stack_fffffffffffffe80;
    checkStruct(builder_01);
    StructBuilder::asReader(&local_238);
    reader.capTable = (CapTableReader *)in_stack_fffffffffffffe88._0_8_;
    reader.data = (void *)in_stack_fffffffffffffe88._8_8_;
    reader.pointers = (WirePointer *)in_stack_fffffffffffffe88._16_8_;
    reader.dataSize = in_stack_fffffffffffffe88._24_4_;
    reader.pointerCount = in_stack_fffffffffffffe88._28_2_;
    reader._38_2_ = in_stack_fffffffffffffe88._30_2_;
    reader.segment = &in_stack_fffffffffffffe80->super_SegmentReader;
    reader._40_8_ = in_stack_fffffffffffffea8;
    checkStruct(reader);
    PointerReader::getRoot
              (&local_260,&segment->super_SegmentReader,(CapTableReader *)0x0,
               (segment->super_SegmentReader).ptr.ptr,4);
    PointerReader::getStruct(local_210,&local_260,(word *)0x0);
    reader_00.capTable = (CapTableReader *)in_stack_fffffffffffffe88._0_8_;
    reader_00.data = (void *)in_stack_fffffffffffffe88._8_8_;
    reader_00.pointers = (WirePointer *)in_stack_fffffffffffffe88._16_8_;
    reader_00.dataSize = in_stack_fffffffffffffe88._24_4_;
    reader_00.pointerCount = in_stack_fffffffffffffe88._28_2_;
    reader_00._38_2_ = in_stack_fffffffffffffe88._30_2_;
    reader_00.segment = &in_stack_fffffffffffffe80->super_SegmentReader;
    reader_00._40_8_ = in_stack_fffffffffffffea8;
    checkStruct(reader_00);
    BuilderArena::~BuilderArena((BuilderArena *)&stack0xfffffffffffffe50);
    MallocMessageBuilder::~MallocMessageBuilder(&local_110);
    return;
  }
  local_23c = 0xf;
  local_268 = AVar3.size_;
  kj::_::Debug::Fault::Fault<kj::Exception::Type,unsigned_int,unsigned_long>
            ((Fault *)&local_260,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
             ,0x154,FAILED,"(15u) == (segments.size())","15u, segments.size()",&local_23c,&local_268
            );
  kj::_::Debug::Fault::fatal((Fault *)&local_260);
}

Assistant:

TEST(WireFormat, StructRoundTrip_OneSegmentPerAllocation) {
  MallocMessageBuilder message(0, AllocationStrategy::FIXED_SIZE);
  BuilderArena arena(&message);
  auto allocation = arena.allocate(1 * WORDS);
  SegmentBuilder* segment = allocation.segment;
  word* rootLocation = allocation.words;

  StructBuilder builder = PointerBuilder::getRoot(segment, nullptr, rootLocation)
      .initStruct(StructSize(2 * WORDS, 4 * POINTERS));
  setupStruct(builder);

  // Verify that we made 15 segments.
  kj::ArrayPtr<const kj::ArrayPtr<const word>> segments = arena.getSegmentsForOutput();
  ASSERT_EQ(15u, segments.size());

  // Check that each segment has the expected size.  Recall that the first word of each segment will
  // actually be a pointer to the first thing allocated within that segment.
  EXPECT_EQ( 1u, segments[ 0].size());  // root ref
  EXPECT_EQ( 7u, segments[ 1].size());  // root struct
  EXPECT_EQ( 2u, segments[ 2].size());  // sub-struct
  EXPECT_EQ( 3u, segments[ 3].size());  // 3-element int32 list
  EXPECT_EQ(10u, segments[ 4].size());  // struct list
  EXPECT_EQ( 2u, segments[ 5].size());  // struct list substruct 1
  EXPECT_EQ( 2u, segments[ 6].size());  // struct list substruct 2
  EXPECT_EQ( 2u, segments[ 7].size());  // struct list substruct 3
  EXPECT_EQ( 2u, segments[ 8].size());  // struct list substruct 4
  EXPECT_EQ( 6u, segments[ 9].size());  // list list
  EXPECT_EQ( 2u, segments[10].size());  // list list sublist 1
  EXPECT_EQ( 2u, segments[11].size());  // list list sublist 2
  EXPECT_EQ( 2u, segments[12].size());  // list list sublist 3
  EXPECT_EQ( 2u, segments[13].size());  // list list sublist 4
  EXPECT_EQ( 3u, segments[14].size());  // list list sublist 5

  checkStruct(builder);
  checkStruct(builder.asReader());
  checkStruct(PointerReader::getRoot(segment, nullptr, segment->getStartPtr(), 4)
      .getStruct(nullptr));
}